

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FANSAircraftFlightIdentification.c
# Opt level: O0

int FANSAircraftFlightIdentification_constraint
              (asn_TYPE_descriptor_t *td,void *sptr,asn_app_constraint_failed_f *ctfailcb,
              void *app_key)

{
  int iVar1;
  undefined8 in_RCX;
  code *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  size_t size;
  IA5String_t *st;
  
  if (in_RSI == (void *)0x0) {
    if (in_RDX != (code *)0x0) {
      (*in_RDX)(in_RCX,in_RDI,0,"%s: value not given (%s:%d)",*in_RDI,
                "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/asn1/FANSAircraftFlightIdentification.c"
                ,0x20);
    }
  }
  else {
    if (((1 < *(uint *)((long)in_RSI + 8)) && (*(uint *)((long)in_RSI + 8) < 8)) &&
       (iVar1 = check_permitted_alphabet_1(in_RSI), iVar1 == 0)) {
      return 0;
    }
    if (in_RDX != (code *)0x0) {
      (*in_RDX)(in_RCX,in_RDI,in_RSI,"%s: constraint failed (%s:%d)",*in_RDI,
                "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/asn1/FANSAircraftFlightIdentification.c"
                ,0x2d);
    }
  }
  return -1;
}

Assistant:

int
FANSAircraftFlightIdentification_constraint(asn_TYPE_descriptor_t *td, const void *sptr,
			asn_app_constraint_failed_f *ctfailcb, void *app_key) {
	const IA5String_t *st = (const IA5String_t *)sptr;
	size_t size;
	
	if(!sptr) {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: value not given (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
	
	size = st->size;
	
	if((size >= 2 && size <= 7)
		 && !check_permitted_alphabet_1(st)) {
		/* Constraint check succeeded */
		return 0;
	} else {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: constraint failed (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
}